

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::framebufferRenderbuffer
          (ReferenceContext *this,deUint32 target,deUint32 attachment,deUint32 renderbuffertarget,
          deUint32 renderbuffer)

{
  _Rb_tree_header *p_Var1;
  Framebuffer *pFVar2;
  Attachment *pAVar3;
  long lVar4;
  Framebuffer *pFVar5;
  int iVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  AttachmentType *attachment_00;
  int iVar9;
  bool bVar10;
  
  if ((int)attachment < 0x8d00) {
    if (attachment == 0x821a) {
      (*(this->super_Context)._vptr_Context[0x20])
                (this,(ulong)target,0x8d00,(ulong)renderbuffertarget,(ulong)renderbuffer);
      (*(this->super_Context)._vptr_Context[0x20])
                (this,(ulong)target,0x8d20,(ulong)renderbuffertarget,(ulong)renderbuffer);
      return;
    }
    if (attachment == 0x8ce0) {
      bVar10 = false;
      lVar4 = 0;
    }
    else {
LAB_00988d0c:
      lVar4 = 3;
      bVar10 = true;
    }
  }
  else {
    if (attachment == 0x8d00) {
      lVar4 = 1;
    }
    else {
      if (attachment != 0x8d20) goto LAB_00988d0c;
      lVar4 = 2;
    }
    bVar10 = false;
  }
  if (((1 < target - 0x8ca8) && (target != 0x8d40)) || (bVar10)) {
LAB_00988d72:
    if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
    }
  }
  else {
    pFVar2 = this->m_drawFramebufferBinding;
    pFVar5 = this->m_readFramebufferBinding;
    if (target == 0x8ca9) {
      pFVar5 = pFVar2;
    }
    if (target == 0x8d40) {
      pFVar5 = pFVar2;
    }
    if (pFVar5 == (Framebuffer *)0x0) goto LAB_00988e24;
    if (renderbuffer == 0) {
      p_Var8 = (_Base_ptr)0x0;
    }
    else {
      p_Var8 = (this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
      if (p_Var8 == (_Base_ptr)0x0) {
LAB_00988e10:
        p_Var8 = (_Base_ptr)0x0;
      }
      else {
        p_Var1 = &(this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = &p_Var1->_M_header;
        do {
          bVar10 = p_Var8[1]._M_color < renderbuffer;
          if (!bVar10) {
            p_Var7 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[bVar10];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var1) || (renderbuffer < p_Var7[1]._M_color))
        goto LAB_00988e10;
        p_Var8 = p_Var7[1]._M_parent;
      }
      if (renderbuffertarget != 0x8d41) goto LAB_00988d72;
      if (p_Var8 == (_Base_ptr)0x0) {
LAB_00988e24:
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x502;
        return;
      }
    }
    pAVar3 = pFVar5->m_attachments + lVar4;
    attachment_00 = &pAVar3->type;
    iVar9 = (uint)(pFVar5 == this->m_readFramebufferBinding) + (uint)(pFVar5 == pFVar2);
    for (iVar6 = iVar9; iVar6 != 0; iVar6 = iVar6 + -1) {
      releaseFboAttachmentReference(this,(Attachment *)attachment_00);
    }
    pAVar3->type = ATTACHMENTTYPE_LAST;
    pAVar3->name = 0;
    pFVar5->m_attachments[lVar4].texTarget = TEXTARGET_LAST;
    pFVar5->m_attachments[lVar4].level = 0;
    pFVar5->m_attachments[lVar4].layer = 0;
    if (p_Var8 != (_Base_ptr)0x0) {
      *attachment_00 = ATTACHMENTTYPE_RENDERBUFFER;
      pFVar5->m_attachments[lVar4].name = *(deUint32 *)&p_Var8->_M_parent;
      for (; iVar9 != 0; iVar9 = iVar9 + -1) {
        acquireFboAttachmentReference(this,(Attachment *)attachment_00);
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::framebufferRenderbuffer (deUint32 target, deUint32 attachment, deUint32 renderbuffertarget, deUint32 renderbuffer)
{
	if (attachment == GL_DEPTH_STENCIL_ATTACHMENT)
	{
		// Attach both to depth and stencil.
		framebufferRenderbuffer(target, GL_DEPTH_ATTACHMENT,	renderbuffertarget, renderbuffer);
		framebufferRenderbuffer(target, GL_STENCIL_ATTACHMENT,	renderbuffertarget, renderbuffer);
	}
	else
	{
		Framebuffer::AttachmentPoint	point			= mapGLAttachmentPoint(attachment);
		Renderbuffer*					rbo				= DE_NULL;

		RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
					target != GL_DRAW_FRAMEBUFFER	&&
					target != GL_READ_FRAMEBUFFER,				GL_INVALID_ENUM,		RC_RET_VOID);
		RC_IF_ERROR(point == Framebuffer::ATTACHMENTPOINT_LAST,	GL_INVALID_ENUM,		RC_RET_VOID);

		// Select binding point.
		rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;
		RC_IF_ERROR(!framebufferBinding, GL_INVALID_OPERATION, RC_RET_VOID);

		// If framebuffer object is bound for both reading and writing then we need to acquire/release multiple references.
		int bindingRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
							+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

		if (renderbuffer != 0)
		{
			rbo = m_renderbuffers.find(renderbuffer);

			RC_IF_ERROR(renderbuffertarget != GL_RENDERBUFFER,	GL_INVALID_ENUM,		RC_RET_VOID);
			RC_IF_ERROR(!rbo,									GL_INVALID_OPERATION,	RC_RET_VOID);
		}

		Framebuffer::Attachment& fboAttachment = framebufferBinding->getAttachment(point);
		for (int ndx = 0; ndx < bindingRefCount; ndx++)
			releaseFboAttachmentReference(fboAttachment);
		fboAttachment = Framebuffer::Attachment();

		if (rbo)
		{
			fboAttachment.type	= Framebuffer::ATTACHMENTTYPE_RENDERBUFFER;
			fboAttachment.name	= rbo->getName();

			for (int ndx = 0; ndx < bindingRefCount; ndx++)
				acquireFboAttachmentReference(fboAttachment);
		}
	}
}